

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

QVariant * QSettingsPrivate::stringToVariant(QString *s)

{
  QRect r;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QLatin1StringView s_05;
  QLatin1StringView s_06;
  QLatin1StringView s_07;
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  char *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  int offset;
  Version version;
  QVariant *result;
  QStringList args_2;
  QStringList args_1;
  QStringList args;
  QByteArray a;
  QDataStream stream;
  int in_stack_fffffffffffffca8;
  OpenModeFlag in_stack_fffffffffffffcac;
  int in_stack_fffffffffffffcb0;
  CaseSensitivity in_stack_fffffffffffffcb4;
  QSize in_stack_fffffffffffffcb8;
  QStringView *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined2 in_stack_fffffffffffffccc;
  QChar in_stack_fffffffffffffcce;
  QStringView *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  QDataStream *in_stack_fffffffffffffce0;
  qsizetype in_stack_fffffffffffffce8;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> flags;
  char *idx;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  int local_1f4;
  QList<QString> local_170;
  QList<QString> local_150;
  QList<QString> local_128 [2];
  QStringView local_f8;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  QChar local_c4;
  char16_t local_c2;
  QStringView local_b0;
  QStringView local_a0;
  QStringView local_68;
  QStringView local_58;
  QChar local_2c;
  QChar local_2a;
  undefined1 local_28 [24];
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QChar::QChar<char16_t,_true>(&local_2a,L'@');
  bVar1 = QString::startsWith((QString *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcce,
                              in_stack_fffffffffffffcb4);
  if (bVar1) {
    QChar::QChar<char16_t,_true>(&local_2c,L')');
    bVar1 = QString::endsWith((QString *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcce,
                              in_stack_fffffffffffffcb4);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffcb8,
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      s_00.m_data._0_4_ = in_stack_fffffffffffffcd8;
      s_00.m_size = (qsizetype)in_stack_fffffffffffffcd0;
      s_00.m_data._4_4_ = in_stack_fffffffffffffcdc;
      bVar1 = QString::startsWith((QString *)
                                  CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),s_00
                                  ,CaseInsensitive);
      if (bVar1) {
        QStringView::QStringView<QString,_true>
                  (in_stack_fffffffffffffcc0,(QString *)in_stack_fffffffffffffcb8);
        local_68 = QStringView::sliced(in_stack_fffffffffffffcd0,
                                       CONCAT26(in_stack_fffffffffffffcce.ucs,
                                                CONCAT24(in_stack_fffffffffffffccc,
                                                         in_stack_fffffffffffffcc8)));
        local_58 = QStringView::chopped
                             ((QStringView *)in_stack_fffffffffffffcb8,
                              CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        QStringView::toLatin1
                  ((QStringView *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   (QByteArray *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        QByteArray::~QByteArray((QByteArray *)0x7a8c15);
        goto LAB_007a96c7;
      }
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffcb8,
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      s_01.m_data._0_4_ = in_stack_fffffffffffffcd8;
      s_01.m_size = (qsizetype)in_stack_fffffffffffffcd0;
      s_01.m_data._4_4_ = in_stack_fffffffffffffcdc;
      bVar1 = QString::startsWith((QString *)
                                  CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),s_01
                                  ,CaseInsensitive);
      if (bVar1) {
        QStringView::QStringView<QString,_true>
                  (in_stack_fffffffffffffcc0,(QString *)in_stack_fffffffffffffcb8);
        local_b0 = QStringView::sliced(in_stack_fffffffffffffcd0,
                                       CONCAT26(in_stack_fffffffffffffcce.ucs,
                                                CONCAT24(in_stack_fffffffffffffccc,
                                                         in_stack_fffffffffffffcc8)));
        local_a0 = QStringView::chopped
                             ((QStringView *)in_stack_fffffffffffffcb8,
                              CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        QStringView::toString
                  ((QStringView *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   (QString *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        QString::~QString((QString *)0x7a8d06);
        goto LAB_007a96c7;
      }
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffcb8,
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      s_02.m_data._0_4_ = in_stack_fffffffffffffcd8;
      s_02.m_size = (qsizetype)in_stack_fffffffffffffcd0;
      s_02.m_data._4_4_ = in_stack_fffffffffffffcdc;
      bVar1 = QString::startsWith((QString *)
                                  CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),s_02
                                  ,CaseInsensitive);
      if (!bVar1) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffcb8,
                   CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
        s_03.m_data._0_4_ = in_stack_fffffffffffffcd8;
        s_03.m_size = (qsizetype)in_stack_fffffffffffffcd0;
        s_03.m_data._4_4_ = in_stack_fffffffffffffcdc;
        bVar1 = QString::startsWith((QString *)
                                    CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                                    s_03,CaseInsensitive);
        if (!bVar1) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffcb8,
                     CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
          s_04.m_data._0_4_ = in_stack_fffffffffffffcd8;
          s_04.m_size = (qsizetype)in_stack_fffffffffffffcd0;
          s_04.m_data._4_4_ = in_stack_fffffffffffffcdc;
          bVar1 = QString::startsWith((QString *)
                                      CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                                      s_04,CaseInsensitive);
          if (bVar1) {
            local_128[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_128[0].d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
            local_128[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            splitArgs((QString *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                      in_stack_fffffffffffffce8);
            qVar3 = QList<QString>::size(local_128);
            bVar1 = qVar3 == 4;
            if (bVar1) {
              QList<QString>::operator[]
                        ((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
              QString::toInt((QString *)in_stack_fffffffffffffcb8,
                             (bool *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             in_stack_fffffffffffffcac);
              QList<QString>::operator[]
                        ((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
              QString::toInt((QString *)in_stack_fffffffffffffcb8,
                             (bool *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             in_stack_fffffffffffffcac);
              QList<QString>::operator[]
                        ((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
              QString::toInt((QString *)in_stack_fffffffffffffcb8,
                             (bool *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             in_stack_fffffffffffffcac);
              QList<QString>::operator[]
                        ((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
              QString::toInt((QString *)in_stack_fffffffffffffcb8,
                             (bool *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             in_stack_fffffffffffffcac);
              QRect::QRect((QRect *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,
                           in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                           in_stack_fffffffffffffca8);
              r.y1.m_i = in_stack_fffffffffffffcb4;
              r.x1.m_i = in_stack_fffffffffffffcb0;
              r.x2.m_i = in_stack_fffffffffffffcb8.wd.m_i;
              r.y2.m_i = in_stack_fffffffffffffcb8.ht.m_i;
              ::QVariant::QVariant
                        ((QVariant *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),r
                        );
            }
            QList<QString>::~QList((QList<QString> *)0x7a9257);
          }
          else {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffcb8,
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
            s_05.m_data._0_4_ = in_stack_fffffffffffffcd8;
            s_05.m_size = (qsizetype)in_stack_fffffffffffffcd0;
            s_05.m_data._4_4_ = in_stack_fffffffffffffcdc;
            bVar1 = QString::startsWith((QString *)
                                        CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8
                                                ),s_05,CaseInsensitive);
            if (!bVar1) {
              idx = in_RSI;
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffcb8,
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
              s_06.m_data._0_4_ = in_stack_fffffffffffffcd8;
              s_06.m_size = (qsizetype)in_stack_fffffffffffffcd0;
              s_06.m_data._4_4_ = in_stack_fffffffffffffcdc;
              bVar1 = QString::startsWith((QString *)
                                          CONCAT44(in_stack_fffffffffffffcac,
                                                   in_stack_fffffffffffffca8),s_06,CaseInsensitive);
              if (bVar1) {
                local_170.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_170.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                local_170.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                splitArgs((QString *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                          (qsizetype)idx);
                qVar3 = QList<QString>::size(&local_170);
                if (qVar3 == 2) {
                  QList<QString>::operator[]
                            ((QList<QString> *)
                             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
                  in_stack_fffffffffffffcdc =
                       QString::toInt((QString *)in_stack_fffffffffffffcb8,
                                      (bool *)CONCAT44(in_stack_fffffffffffffcb4,
                                                       in_stack_fffffffffffffcb0),
                                      in_stack_fffffffffffffcac);
                  in_stack_fffffffffffffcd0 =
                       (QStringView *)
                       QList<QString>::operator[]
                                 ((QList<QString> *)
                                  CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                                  CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
                  iVar2 = QString::toInt((QString *)in_stack_fffffffffffffcb8,
                                         (bool *)CONCAT44(in_stack_fffffffffffffcb4,
                                                          in_stack_fffffffffffffcb0),
                                         in_stack_fffffffffffffcac);
                  in_stack_fffffffffffffccc = (undefined2)iVar2;
                  in_stack_fffffffffffffcce.ucs = (char16_t)((uint)iVar2 >> 0x10);
                  QPoint::QPoint((QPoint *)
                                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                                 in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
                  ::QVariant::QVariant
                            ((QVariant *)
                             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             (QPoint)in_stack_fffffffffffffcb8);
                }
                QList<QString>::~QList((QList<QString> *)0x7a95a5);
                if (qVar3 == 2) goto LAB_007a96c7;
              }
              else {
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffcb8,
                           CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
                bVar1 = ::operator==((QString *)in_stack_fffffffffffffcb8,
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
                if (bVar1) {
                  ::QVariant::QVariant((QVariant *)0x7a960c);
                  goto LAB_007a96c7;
                }
              }
              goto LAB_007a961f;
            }
            local_150.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_150.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
            local_150.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            splitArgs((QString *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                      in_stack_fffffffffffffce8);
            qVar3 = QList<QString>::size(&local_150);
            bVar1 = qVar3 == 2;
            if (bVar1) {
              QList<QString>::operator[]
                        ((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
              QString::toInt((QString *)in_stack_fffffffffffffcb8,
                             (bool *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             in_stack_fffffffffffffcac);
              QList<QString>::operator[]
                        ((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
              QString::toInt((QString *)in_stack_fffffffffffffcb8,
                             (bool *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                             in_stack_fffffffffffffcac);
              QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                           in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
              ::QVariant::QVariant
                        ((QVariant *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         in_stack_fffffffffffffcb8);
            }
            QList<QString>::~QList((QList<QString> *)0x7a93fe);
          }
          if (bVar1) goto LAB_007a96c7;
          goto LAB_007a961f;
        }
      }
      flags.i = (Int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
      local_c2 = (char16_t)
                 QString::at((QString *)in_stack_fffffffffffffcb8,
                             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      QChar::QChar<char16_t,_true>(&local_c4,L'D');
      bVar1 = ::operator==((QChar *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                           (QChar *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      if (bVar1) {
        local_1f4 = 0x11;
      }
      else {
        local_1f4 = 7;
      }
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      QStringView::QStringView<QString,_true>
                (in_stack_fffffffffffffcc0,(QString *)in_stack_fffffffffffffcb8);
      local_f8 = QStringView::sliced(in_stack_fffffffffffffcd0,
                                     CONCAT26(in_stack_fffffffffffffcce.ucs,
                                              CONCAT24(in_stack_fffffffffffffccc,
                                                       in_stack_fffffffffffffcc8)));
      QStringView::toLatin1
                ((QStringView *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 in_stack_fffffffffffffcac);
      QDataStream::QDataStream
                (in_stack_fffffffffffffce0,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (OpenMode)flags.i);
      QDataStream::setVersion((QDataStream *)local_28,local_1f4);
      *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&(in_RDI->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::QVariant((QVariant *)0x7a8f57);
      ::operator>>((QDataStream *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   (QVariant *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      QDataStream::~QDataStream
                ((QDataStream *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      QByteArray::~QByteArray((QByteArray *)0x7a9004);
      goto LAB_007a96c7;
    }
LAB_007a961f:
    Qt::Literals::StringLiterals::operator____L1
              (in_RSI,CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    s_07.m_data._0_4_ = in_stack_fffffffffffffcd8;
    s_07.m_size = (qsizetype)in_stack_fffffffffffffcd0;
    s_07.m_data._4_4_ = in_stack_fffffffffffffcdc;
    bVar1 = QString::startsWith((QString *)
                                CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),s_07,
                                CaseInsensitive);
    if (bVar1) {
      QString::sliced((QString *)in_stack_fffffffffffffcd0,
                      CONCAT26(in_stack_fffffffffffffcce.ucs,
                               CONCAT24(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 (QString *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      QString::~QString((QString *)0x7a96ae);
      goto LAB_007a96c7;
    }
  }
  ::QVariant::QVariant
            ((QVariant *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
             (QString *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
LAB_007a96c7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QVariant QSettingsPrivate::stringToVariant(const QString &s)
{
    if (s.startsWith(u'@')) {
        if (s.endsWith(u')')) {
            if (s.startsWith("@ByteArray("_L1)) {
                return QVariant(QStringView{s}.sliced(11).chopped(1).toLatin1());
            } else if (s.startsWith("@String("_L1)) {
                return QVariant(QStringView{s}.sliced(8).chopped(1).toString());
            } else if (s.startsWith("@Variant("_L1)
                       || s.startsWith("@DateTime("_L1)) {
#ifndef QT_NO_DATASTREAM
                QDataStream::Version version;
                int offset;
                if (s.at(1) == u'D') {
                    version = QDataStream::Qt_5_6;
                    offset = 10;
                } else {
                    version = QDataStream::Qt_4_0;
                    offset = 9;
                }
                QByteArray a = QStringView{s}.sliced(offset).toLatin1();
                QDataStream stream(&a, QIODevice::ReadOnly);
                stream.setVersion(version);
                QVariant result;
                stream >> result;
                return result;
#else
                Q_ASSERT(!"QSettings: Cannot load custom types without QDataStream support");
#endif
            } else if (s.startsWith("@Rect("_L1)) {
                QStringList args = QSettingsPrivate::splitArgs(s, 5);
                if (args.size() == 4)
                    return QVariant(QRect(args[0].toInt(), args[1].toInt(), args[2].toInt(), args[3].toInt()));
            } else if (s.startsWith("@Size("_L1)) {
                QStringList args = QSettingsPrivate::splitArgs(s, 5);
                if (args.size() == 2)
                    return QVariant(QSize(args[0].toInt(), args[1].toInt()));
            } else if (s.startsWith("@Point("_L1)) {
                QStringList args = QSettingsPrivate::splitArgs(s, 6);
                if (args.size() == 2)
                    return QVariant(QPoint(args[0].toInt(), args[1].toInt()));
            } else if (s == "@Invalid()"_L1) {
                return QVariant();
            }

        }
        if (s.startsWith("@@"_L1))
            return QVariant(s.sliced(1));
    }

    return QVariant(s);
}